

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O2

GlobRank __thiscall
slang::svGlob(slang *this,path *basePath,string_view pattern,GlobMode mode,
             SmallVector<std::filesystem::__cxx11::path,_2UL> *results,bool expandEnvVars,
             error_code *ec)

{
  char **ppcVar1;
  path *ppVar2;
  bool bVar3;
  char cVar4;
  GlobRank GVar5;
  size_type sVar6;
  int iVar7;
  path *p;
  pointer ppVar8;
  undefined4 uVar9;
  long lVar10;
  path *ctx;
  undefined4 in_register_00000084;
  SmallVectorBase<std::filesystem::__cxx11::path> *this_00;
  char **ptr;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view pattern_00;
  string_view pattern_01;
  basic_string_view<char,_std::char_traits<char>_> __x;
  undefined7 in_stack_00000009;
  bool *in_stack_fffffffffffffec8;
  bool anyWildcards;
  int local_12c;
  path *local_128;
  path patternPath;
  string_view pattern_local;
  string patternStr;
  error_code localEc;
  SmallVector<std::filesystem::__cxx11::path,_2UL> local;
  
  this_00 = (SmallVectorBase<std::filesystem::__cxx11::path> *)CONCAT44(in_register_00000084,mode);
  iVar7 = (int)pattern._M_str;
  local_128 = (path *)this;
  pattern_local._M_len = (size_t)basePath;
  pattern_local._M_str = (char *)pattern._M_len;
  std::error_code::clear((error_code *)CONCAT71(in_stack_00000009,expandEnvVars));
  __y._M_str = "-";
  __y._M_len = 1;
  __x._M_str = (char *)pattern._M_len;
  __x._M_len = (size_t)basePath;
  bVar3 = std::operator==(__x,__y);
  local_12c = iVar7;
  if ((iVar7 == 0) && (bVar3)) {
    SmallVectorBase<std::filesystem::__cxx11::path>::emplace_back<char_const(&)[2]>
              (this_00,(char (*) [2])0x484825);
    return ExactPath;
  }
  std::filesystem::__cxx11::path::path(&patternPath);
  if ((char)results == '\0') {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              ((path *)&local,&pattern_local,auto_format);
    std::filesystem::__cxx11::path::operator=(&patternPath,(path *)&local);
    std::filesystem::__cxx11::path::~path((path *)&local);
  }
  else {
    patternStr._M_dataplus._M_p = (pointer)&patternStr.field_2;
    patternStr._M_string_length = 0;
    patternStr.field_2._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&patternStr,pattern_local._M_len);
    localEc._0_8_ = pattern_local._M_str;
    ptr = (char **)(pattern_local._M_str + pattern_local._M_len);
    while ((char **)localEc._0_8_ != ptr) {
      ppcVar1 = (char **)(localEc._0_8_ + 1);
      cVar4 = *(char *)localEc._0_8_;
      localEc._0_8_ = ppcVar1;
      if (ppcVar1 == ptr || cVar4 != '$') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&patternStr,cVar4);
      }
      else {
        OS::parseEnvVar_abi_cxx11_
                  ((string *)&local,(OS *)&localEc,ptr,
                   (char *)CONCAT71((int7)((ulong)ppcVar1 >> 8),ppcVar1 == ptr || cVar4 != '$'));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&patternStr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local);
        std::__cxx11::string::~string((string *)&local);
      }
    }
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)&local,&patternStr,auto_format);
    std::filesystem::__cxx11::path::operator=(&patternPath,(path *)&local);
    std::filesystem::__cxx11::path::~path((path *)&local);
    std::__cxx11::string::~string((string *)&patternStr);
  }
  std::filesystem::__cxx11::path::lexically_normal();
  std::filesystem::__cxx11::path::operator=(&patternPath,(path *)&local);
  std::filesystem::__cxx11::path::~path((path *)&local);
  local.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
       (pointer)local.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
  local.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
  local.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
  anyWildcards = false;
  cVar4 = std::filesystem::__cxx11::path::has_root_path();
  if (cVar4 == '\0') {
    pattern_01._M_str._0_4_ = local_12c;
    pattern_01._M_len = (size_t)patternPath._M_pathname._M_dataplus._M_p;
    pattern_01._M_str._4_4_ = 0;
    GVar5 = svGlobInternal((slang *)local_128,(path *)patternPath._M_pathname._M_string_length,
                           pattern_01,(GlobMode)&local,
                           (SmallVector<std::filesystem::__cxx11::path,_2UL> *)&anyWildcards,
                           in_stack_fffffffffffffec8);
  }
  else {
    std::filesystem::__cxx11::path::root_path();
    std::filesystem::__cxx11::path::relative_path();
    pattern_00._M_str._0_4_ = local_12c;
    pattern_00._M_len = localEc._0_8_;
    pattern_00._M_str._4_4_ = 0;
    GVar5 = svGlobInternal((slang *)&patternStr,(path *)localEc._M_cat,pattern_00,(GlobMode)&local,
                           (SmallVector<std::filesystem::__cxx11::path,_2UL> *)&anyWildcards,
                           in_stack_fffffffffffffec8);
    std::filesystem::__cxx11::path::~path((path *)&localEc);
    std::filesystem::__cxx11::path::~path((path *)&patternStr);
  }
  localEc._0_8_ = localEc._0_8_ & 0xffffffff00000000;
  localEc._M_cat = (error_category *)std::_V2::system_category();
  ctx = (path *)local.super_SmallVectorBase<std::filesystem::__cxx11::path>.len;
  SmallVectorBase<std::filesystem::__cxx11::path>::reserve
            (this_00,local.super_SmallVectorBase<std::filesystem::__cxx11::path>.len);
  ppVar8 = local.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
  for (lVar10 = local.super_SmallVectorBase<std::filesystem::__cxx11::path>.len * 0x28; lVar10 != 0;
      lVar10 = lVar10 + -0x28) {
    ctx = ppVar8;
    std::filesystem::weakly_canonical((path *)&patternStr,(error_code *)ppVar8);
    if (localEc._M_value == 0) {
      ctx = (path *)&patternStr;
      SmallVectorBase<std::filesystem::__cxx11::path>::emplace_back<std::filesystem::__cxx11::path>
                (this_00,(path *)&patternStr);
    }
    std::filesystem::__cxx11::path::~path((path *)&patternStr);
    ppVar8 = ppVar8 + 1;
  }
  if ((GVar5 != SimpleName) || (anyWildcards != false)) goto LAB_00203ef4;
  GVar5 = ExactPath;
  if (this_00->len != 0) goto LAB_00203ef4;
  cVar4 = std::filesystem::__cxx11::path::has_root_path();
  ppVar2 = (path *)CONCAT71(in_stack_00000009,expandEnvVars);
  uVar9 = 2;
  if (cVar4 == '\0') {
    std::filesystem::__cxx11::operator/((path *)&patternStr,local_128,&patternPath);
    std::filesystem::__cxx11::path::operator=(&patternPath,(path *)&patternStr);
    std::filesystem::__cxx11::path::~path((path *)&patternStr);
  }
  ctx = ppVar2;
  cVar4 = std::filesystem::status(&patternPath,(error_code *)ppVar2);
  if (*(int *)&(ppVar2->_M_pathname)._M_dataplus._M_p != 0) goto LAB_00203ef4;
  if (cVar4 == -1) {
LAB_00203ed3:
    sVar6 = std::_V2::generic_category();
  }
  else {
    if (cVar4 == '\b') {
      uVar9 = 0xd;
      goto LAB_00203ed3;
    }
    if (cVar4 == '\x02') {
      uVar9 = 0x15;
      goto LAB_00203ed3;
    }
    sVar6 = std::_V2::generic_category();
    uVar9 = 0x5f;
    if (local_12c == 1) {
      uVar9 = 0x14;
    }
  }
  *(undefined4 *)&(ppVar2->_M_pathname)._M_dataplus._M_p = uVar9;
  (ppVar2->_M_pathname)._M_string_length = sVar6;
  GVar5 = ExactPath;
LAB_00203ef4:
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
            (&local.super_SmallVectorBase<std::filesystem::__cxx11::path>,(EVP_PKEY_CTX *)ctx);
  std::filesystem::__cxx11::path::~path(&patternPath);
  return GVar5;
}

Assistant:

SLANG_EXPORT GlobRank svGlob(const fs::path& basePath, std::string_view pattern, GlobMode mode,
                             SmallVector<fs::path>& results, bool expandEnvVars,
                             std::error_code& ec) {
    ec.clear();
    if (pattern == "-"sv && mode == GlobMode::Files) {
        // This is interpretted as trying to read stdin.
        results.emplace_back("-");
        return GlobRank::ExactPath;
    }

    fs::path patternPath;
    if (expandEnvVars) {
        std::string patternStr;
        patternStr.reserve(pattern.size());

        auto ptr = pattern.data();
        auto end = ptr + pattern.size();
        while (ptr != end) {
            char c = *ptr++;
            if (c == '$' && ptr != end)
                patternStr.append(OS::parseEnvVar(ptr, end));
            else
                patternStr.push_back(c);
        }

        patternPath = fs::path(patternStr);
    }
    else {
        patternPath = fs::path(pattern);
    }

    // Normalize the path to remove duplicate separators, figure out
    // whether we have an absolute path, etc.
    patternPath = patternPath.lexically_normal();

    SmallVector<fs::path> local;
    GlobRank rank;
    bool anyWildcards = false;
    if (patternPath.has_root_path()) {
        rank = svGlobInternal(patternPath.root_path(), getU8Str(patternPath.relative_path()), mode,
                              local, anyWildcards);
    }
    else {
        rank = svGlobInternal(basePath, getU8Str(patternPath), mode, local, anyWildcards);
    }

    // Results paths are always made canonical.
    std::error_code localEc;
    results.reserve(local.size());
    for (auto& p : local) {
        auto canonical = fs::weakly_canonical(p, localEc);
        if (!localEc)
            results.emplace_back(std::move(canonical));
    }

    if (!anyWildcards && rank == GlobRank::SimpleName) {
        // If there were no wildcards at all and we had a simple name match,
        // promote the rank to an exact path match.
        rank = GlobRank::ExactPath;
        if (results.empty()) {
            if (!patternPath.has_root_path())
                patternPath = basePath / patternPath;

            auto status = fs::status(patternPath, ec);
            if (!ec) {
                switch (status.type()) {
                    case fs::file_type::directory:
                        ec = make_error_code(std::errc::is_a_directory);
                        break;
                    case fs::file_type::not_found:
                        ec = make_error_code(std::errc::no_such_file_or_directory);
                        break;
                    case fs::file_type::unknown:
                        ec = make_error_code(std::errc::permission_denied);
                        break;
                    default:
                        if (mode == GlobMode::Directories)
                            ec = make_error_code(std::errc::not_a_directory);
                        else
                            ec = make_error_code(std::errc::not_supported);
                        break;
                }
            }
        }
    }

    return rank;
}